

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallfmv_await_s(void *func,void **keys,void **values,size_t size,
                          _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                          _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  int iVar1;
  type_id tVar2;
  uint uVar3;
  type_id tVar4;
  type_id tVar5;
  signature s;
  value pvVar6;
  char *pcVar7;
  size_t sVar8;
  type ptVar9;
  function_return v;
  size_t index;
  void *args [16];
  undefined8 in_stack_ffffffffffffff18;
  void *local_b8 [17];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    tVar2 = (type_id)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (size != 0) {
      index = 0;
      do {
        iVar1 = value_validate(keys[index]);
        if (iVar1 != 0) {
          pcVar7 = "Invalid key at position %zu when calling to metacallfmv_await_s";
          sVar8 = 0x6c6;
LAB_001275b1:
          log_write_impl_va("metacall",sVar8,"metacallfmv_await_s",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                            ,LOG_LEVEL_ERROR,pcVar7,index);
          return (void *)0x0;
        }
        iVar1 = value_validate(values[index]);
        if (iVar1 != 0) {
          pcVar7 = "Invalid value at position %zu when calling to metacallfmv_await_s";
          sVar8 = 0x6cd;
          goto LAB_001275b1;
        }
        tVar2 = value_type_id(keys[index]);
        iVar1 = type_id_string(tVar2);
        if (iVar1 == 0) {
          pcVar7 = value_to_string(keys[index]);
          sVar8 = signature_get_index(s,pcVar7);
        }
        else {
          iVar1 = type_id_integer(tVar2);
          if (iVar1 != 0) {
            return (void *)0x0;
          }
          pvVar6 = value_type_cast(s,(type_id)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          if (pvVar6 == (value)0x0) {
            pvVar6 = keys[index];
          }
          else {
            keys[index] = pvVar6;
          }
          uVar3 = value_to_int(pvVar6);
          if (0xf < uVar3) {
            return (void *)0x0;
          }
          sVar8 = (size_t)uVar3;
        }
        if (0xf < sVar8) {
          return (void *)0x0;
        }
        ptVar9 = signature_get_type(s,index);
        if (ptVar9 != (type)0x0) {
          tVar2 = type_index(ptVar9);
          tVar4 = value_type_id(values[index]);
          if ((tVar2 != tVar4) &&
             (pvVar6 = value_type_cast(s,(type_id)((ulong)in_stack_ffffffffffffff18 >> 0x20)),
             pvVar6 != (value)0x0)) {
            values[index] = pvVar6;
          }
        }
        tVar2 = (type_id)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        local_b8[sVar8] = values[index];
        index = index + 1;
      } while (size != index);
    }
    v = function_await((function_conflict)func,local_b8,size,
                       (function_resolve_callback)resolve_callback,
                       (function_reject_callback)reject_callback,data);
    if (v != (function_return)0x0) {
      ptVar9 = signature_get_return(s);
      if (ptVar9 == (type)0x0) {
        return v;
      }
      tVar4 = type_index(ptVar9);
      tVar5 = value_type_id(v);
      if (tVar4 != tVar5) {
        pvVar6 = value_type_cast(s,tVar2);
        if (pvVar6 != (value)0x0) {
          return pvVar6;
        }
        return v;
      }
      return v;
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfmv_await_s(void *func, void *keys[], void *values[], size_t size, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(keys[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid key at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			if (value_validate(values[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid value at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			type_id key_id = value_type_id((value)keys[iterator]);

			size_t index = METACALL_ARGS_SIZE;

			/* Obtain signature index */
			if (type_id_string(key_id) == 0)
			{
				const char *key = value_to_string(keys[iterator]);

				index = signature_get_index(s, key);
			}
			else if (type_id_integer(key_id) == 0)
			{
				value cast_key = value_type_cast((value)keys[iterator], TYPE_INT);

				int key_index;

				if (cast_key != NULL)
				{
					keys[iterator] = cast_key;
				}

				key_index = value_to_int((value)keys[iterator]);

				if (key_index >= 0 && key_index < METACALL_ARGS_SIZE)
				{
					index = (size_t)key_index;
				}
			}

			/* If index is valid, cast values and build arguments */
			if (index < METACALL_ARGS_SIZE)
			{
				type t = signature_get_type(s, iterator);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id((value)values[iterator]))
					{
						value cast_arg = value_type_cast((value)values[iterator], id);

						if (cast_arg != NULL)
						{
							values[iterator] = cast_arg;
						}
					}
				}

				args[index] = values[iterator];
			}
			else
			{
				/* TODO: Handle properly exceptions */
				return NULL;
			}
		}

		ret = function_await(f, args, size, resolve_callback, reject_callback, data);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}